

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O2

bool FIX::group_order::compare(int x,int y,int *order,int largest)

{
  int iVar1;
  int iVar2;
  
  if (largest < y || largest < x) {
    return x < y || x <= largest;
  }
  iVar1 = order[x];
  iVar2 = order[y];
  if (iVar1 == 0 && iVar2 == 0) {
    return x < y;
  }
  if (iVar1 != 0) {
    return iVar1 < iVar2 || iVar2 == 0;
  }
  return false;
}

Assistant:

static bool compare( const int x, const int y, int* order, int largest )
  {
    if ( x <= largest && y <= largest )
    {
      int iX = order[ x ];
      int iY = order[ y ];
      if ( iX == 0 && iY == 0 )
        return x < y;
      else if ( iX == 0 )
        return false;
      else if ( iY == 0 )
        return true;
      else
        return iX < iY;
    }
    else if ( x <= largest ) return true;
    else if ( y <= largest ) return false;
    else return x < y;
  }